

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class1_test_matching.cc
# Opt level: O0

void feature_set_matching(Ptr *image1,Ptr *image2)

{
  pointer *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  Vector<float,_128> *pVVar2;
  float *pfVar3;
  size_type sVar4;
  float *pfVar5;
  size_type sVar6;
  ostream *poVar7;
  Vector<float,_64> *pVVar8;
  Descriptor *pDVar9;
  reference pvVar10;
  reference pvVar11;
  shared_ptr<core::Image<unsigned_char>_> local_3d0;
  allocator local_3b9;
  string local_3b8 [8];
  string output_filename;
  undefined1 local_398 [32];
  undefined1 local_378 [8];
  Ptr match_image;
  shared_ptr<core::Image<unsigned_char>_> local_358;
  shared_ptr<const_core::Image<unsigned_char>_> local_348;
  shared_ptr<core::Image<unsigned_char>_> local_338;
  undefined1 local_328 [8];
  Keypoint kp_1;
  Descriptor *descr_1;
  size_t i_1;
  vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> features2;
  Keypoint kp;
  Descriptor *descr;
  size_t i;
  vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> features1;
  Result matching;
  Result surf_matching;
  AlignedMemory<math::Vec64f,_16> surf_descr2;
  AlignedMemory<math::Vec64f,_16> surf_descr1;
  Options surf_matching_opts;
  Result sift_matching;
  AlignedMemory<math::Vec128f,_16> sift_descr2;
  AlignedMemory<math::Vec128f,_16> sift_descr1;
  Options sift_matching_opts;
  undefined1 local_198 [8];
  FeatureSet feat2;
  shared_ptr<core::Image<unsigned_char>_> local_f0;
  undefined1 local_e0 [8];
  FeatureSet feat1;
  Options feature_set_opts;
  Ptr *image2_local;
  Ptr *image1_local;
  
  sfm::FeatureSet::Options::Options((Options *)&feat1.field_0x94);
  feat1._148_4_ = 1;
  sfm::FeatureSet::FeatureSet((FeatureSet *)local_e0,(Options *)&feat1.field_0x94);
  std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr(&local_f0,image1);
  sfm::FeatureSet::compute_features((FeatureSet *)local_e0,&local_f0);
  std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_f0);
  sfm::FeatureSet::FeatureSet((FeatureSet *)local_198,(Options *)&feat1.field_0x94);
  std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr
            ((shared_ptr<core::Image<unsigned_char>_> *)&sift_matching_opts.lowe_ratio_threshold,
             image2);
  sfm::FeatureSet::compute_features
            ((FeatureSet *)local_198,(Ptr *)&sift_matching_opts.lowe_ratio_threshold);
  std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr
            ((shared_ptr<core::Image<unsigned_char>_> *)&sift_matching_opts.lowe_ratio_threshold);
  sift_descr1.
  super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x80;
  sift_matching_opts.descriptor_length = (int)std::numeric_limits<float>::max();
  std::vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>::
  vector((vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
          *)&sift_descr2.
             super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>::
  vector((vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
          *)&sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  convert_sift_descriptors<float>
            ((Descriptors *)
             &feat1.colors.
              super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (AlignedMemory<math::Vector<float,_128>_> *)
             &sift_descr2.
              super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  convert_sift_descriptors<float>
            ((Descriptors *)
             &feat2.colors.
              super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (AlignedMemory<math::Vector<float,_128>_> *)
             &sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  features::Matching::Result::Result((Result *)&surf_matching_opts.lowe_ratio_threshold);
  pVVar2 = std::
           vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
           ::data((vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
                   *)&sift_descr2.
                      super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pfVar3 = math::Vector<float,_128>::begin(pVVar2);
  sVar4 = std::
          vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
          ::size((vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
                  *)&sift_descr2.
                     super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar2 = std::
           vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
           ::data((vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
                   *)&sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pfVar5 = math::Vector<float,_128>::begin(pVVar2);
  sVar6 = std::
          vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
          ::size((vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
                  *)&sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
  features::Matching::twoway_match<float>
            ((Options *)
             ((long)&sift_descr1.
                     super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pfVar3,(int)sVar4,
             pfVar5,(int)sVar6,(Result *)&surf_matching_opts.lowe_ratio_threshold);
  features::Matching::remove_inconsistent_matches
            ((Result *)&surf_matching_opts.lowe_ratio_threshold);
  poVar7 = std::operator<<((ostream *)&std::cout,"Consistent Sift Matches: ");
  iVar1 = features::Matching::count_consistent_matches
                    ((Result *)&surf_matching_opts.lowe_ratio_threshold);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar1);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  surf_descr1.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x40;
  surf_matching_opts.descriptor_length = (int)std::numeric_limits<float>::max();
  std::vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>::
  vector((vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_> *)
         &surf_descr2.
          super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>::
  vector((vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_> *)
         &surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage);
  convert_surf_descriptors<float>
            ((Descriptors *)
             &feat1.sift_descriptors.
              super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (AlignedMemory<math::Vector<float,_64>_> *)
             &surf_descr2.
              super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  convert_surf_descriptors<float>
            ((Descriptors *)
             &feat2.sift_descriptors.
              super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (AlignedMemory<math::Vector<float,_64>_> *)
             &surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  features::Matching::Result::Result
            ((Result *)
             &matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pVVar8 = std::
           vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>::
           data((vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                 *)&surf_descr2.
                    super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pfVar3 = math::Vector<float,_64>::begin(pVVar8);
  sVar4 = std::
          vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>::
          size((vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                *)&surf_descr2.
                   super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar8 = std::
           vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>::
           data((vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                 *)&surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  pfVar5 = math::Vector<float,_64>::begin(pVVar8);
  sVar6 = std::
          vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>::
          size((vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                *)&surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  features::Matching::twoway_match<float>
            ((Options *)
             ((long)&surf_descr1.
                     super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pfVar3,(int)sVar4,
             pfVar5,(int)sVar6,
             (Result *)
             &matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  features::Matching::remove_inconsistent_matches
            ((Result *)
             &matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar7 = std::operator<<((ostream *)&std::cout,"Consistent Surf Matches: ");
  iVar1 = features::Matching::count_consistent_matches
                    ((Result *)
                     &matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar1);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  this = &features1.
          super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  features::Matching::Result::Result((Result *)this);
  features::Matching::combine_results
            ((Result *)&surf_matching_opts.lowe_ratio_threshold,
             (Result *)
             &matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Result *)this);
  poVar7 = std::operator<<((ostream *)&std::cout,"Consistent Matches: ");
  iVar1 = features::Matching::count_consistent_matches
                    ((Result *)
                     &features1.
                      super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar1);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>::
  vector((vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> *)
         &i);
  for (descr = (Descriptor *)0x0;
      pDVar9 = (Descriptor *)
               std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
               ::size((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                       *)&feat1.colors.
                          super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage), descr < pDVar9;
      descr = (Descriptor *)((long)&descr->x + 1)) {
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &features1.
                          super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)descr);
    if (*pvVar10 != -1) {
      pvVar11 = std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                ::operator[]((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                              *)&feat1.colors.
                                 super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)descr
                            );
      features2.
      super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = pvVar11->x;
      features2.
      super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = pvVar11->y;
      std::vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>::
      push_back((vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                 *)&i,(value_type *)
                      &features2.
                       super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>::
  vector((vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> *)
         &i_1);
  for (descr_1 = (Descriptor *)0x0;
      pDVar9 = (Descriptor *)
               std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
               ::size((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                       *)&feat2.colors.
                          super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage), descr_1 < pDVar9;
      descr_1 = (Descriptor *)((long)&descr_1->x + 1)) {
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage,(size_type)descr_1);
    if (*pvVar10 != -1) {
      kp_1._8_8_ = std::
                   vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
                   operator[]((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                               *)&feat2.colors.
                                  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (size_type)descr_1);
      kp_1.y = ((reference)kp_1._8_8_)->orientation;
      kp_1.x = ((reference)kp_1._8_8_)->scale * 3.0;
      local_328._0_4_ = ((reference)kp_1._8_8_)->x;
      local_328._4_4_ = ((reference)kp_1._8_8_)->y;
      std::vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>::
      push_back((vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                 *)&i_1,(value_type *)local_328);
    }
  }
  std::shared_ptr<core::Image<unsigned_char>const>::shared_ptr<core::Image<unsigned_char>,void>
            ((shared_ptr<core::Image<unsigned_char>const> *)&local_348,image1);
  features::Visualizer::draw_keypoints
            ((Visualizer *)&local_338,(ConstPtr *)&local_348,
             (vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
              *)&i,RADIUS_BOX_ORIENTATION);
  std::shared_ptr<core::Image<unsigned_char>_>::operator=(image1,&local_338);
  std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_338);
  std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_348);
  this_00 = &match_image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::shared_ptr<core::Image<unsigned_char>const>::shared_ptr<core::Image<unsigned_char>,void>
            ((shared_ptr<core::Image<unsigned_char>const> *)this_00,image2);
  features::Visualizer::draw_keypoints
            ((Visualizer *)&local_358,(ConstPtr *)this_00,
             (vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
              *)&i_1,RADIUS_BOX_ORIENTATION);
  std::shared_ptr<core::Image<unsigned_char>_>::operator=(image2,&local_358);
  std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_358);
  std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr
            ((shared_ptr<const_core::Image<unsigned_char>_> *)
             &match_image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr
            ((shared_ptr<core::Image<unsigned_char>_> *)(local_398 + 0x10),image1);
  std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr
            ((shared_ptr<core::Image<unsigned_char>_> *)local_398,image2);
  visualize_matching((Result *)local_378,
                     (Ptr *)&features1.
                             super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (shared_ptr<core::Image<unsigned_char>_> *)(local_398 + 0x10),
                     (vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                     local_398,
                     (vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                     &feat1);
  std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr
            ((shared_ptr<core::Image<unsigned_char>_> *)local_398);
  std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr
            ((shared_ptr<core::Image<unsigned_char>_> *)(local_398 + 0x10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"./tmp/matching_featureset.png",&local_3b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  poVar7 = std::operator<<((ostream *)&std::cout,"Saving visualization to ");
  poVar7 = std::operator<<(poVar7,local_3b8);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr
            (&local_3d0,(shared_ptr<core::Image<unsigned_char>_> *)local_378);
  core::image::save_file(&local_3d0,(string *)local_3b8);
  std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_3d0);
  std::__cxx11::string::~string(local_3b8);
  std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr
            ((shared_ptr<core::Image<unsigned_char>_> *)local_378);
  std::vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>::
  ~vector((vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> *
          )&i_1);
  std::vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>::
  ~vector((vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> *
          )&i);
  features::Matching::Result::~Result
            ((Result *)
             &features1.
              super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  features::Matching::Result::~Result
            ((Result *)
             &matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>::
  ~vector((vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_> *
          )&surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>::
  ~vector((vector<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_> *
          )&surf_descr2.
            super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  features::Matching::Result::~Result((Result *)&surf_matching_opts.lowe_ratio_threshold);
  std::vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>::
  ~vector((vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
           *)&sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>::
  ~vector((vector<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
           *)&sift_descr2.
              super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sfm::FeatureSet::~FeatureSet((FeatureSet *)local_198);
  sfm::FeatureSet::~FeatureSet((FeatureSet *)local_e0);
  return;
}

Assistant:

void
feature_set_matching (core::ByteImage::Ptr image1, core::ByteImage::Ptr image2)
{
    /*FeatureSet 计算并存储一个视角的特征点，包含SIFT和SURF特征点 */
    sfm::FeatureSet::Options feature_set_opts;
    //feature_types设置为FEATURE_ALL表示检测SIFT和SURF两种特征点进行匹配
    feature_set_opts.feature_types = sfm::FeatureSet::FEATURE_SIFT;
    feature_set_opts.sift_opts.verbose_output = true;
    //feature_set_opts.surf_opts.verbose_output = true;
    //feature_set_opts.surf_opts.contrast_threshold = 500.0f;

    // 计算第一幅图像的SIT和SURF特征点
    sfm::FeatureSet feat1(feature_set_opts);
    feat1.compute_features(image1);
    // 计算第二幅图像的SIFT和SURF特征点
    sfm::FeatureSet feat2(feature_set_opts);
    feat2.compute_features(image2);

    /* 对sift特征描述子进行匹配 */
    // sift 特征描述子匹配参数
    sfm::Matching::Options sift_matching_opts;
    sift_matching_opts.lowe_ratio_threshold = 0.8f;
    sift_matching_opts.descriptor_length = 128;
    sift_matching_opts.distance_threshold = std::numeric_limits<float>::max();

#if DISCRETIZE_DESCRIPTORS
    util::AlignedMemory<math::Vec128us, 16> sift_descr1, sift_descr2;
#else
    util::AlignedMemory<math::Vec128f, 16> sift_descr1, sift_descr2;
#endif
    // 将描述子转成特定的内存格式
    convert_sift_descriptors(feat1.sift_descriptors, &sift_descr1);
    convert_sift_descriptors(feat2.sift_descriptors, &sift_descr2);

    // 进行双向匹配
    sfm::Matching::Result sift_matching;
    sfm::Matching::twoway_match(sift_matching_opts,
        sift_descr1.data()->begin(), sift_descr1.size(),
        sift_descr2.data()->begin(), sift_descr2.size(),
        &sift_matching);

    // 去除不一致的匹配对，匹配对feature1和feature2是一致的需要满足，feature1的最近邻居
    // 是feature2，feature2的最近邻是feature1
    sfm::Matching::remove_inconsistent_matches(&sift_matching);
    std::cout << "Consistent Sift Matches: "
        << sfm::Matching::count_consistent_matches(sift_matching)
        << std::endl;


    /*  对surf特征描述子进行匹配  */
    // surf特征匹配参数
    sfm::Matching::Options surf_matching_opts;
    // 最近邻和次近邻的比
    surf_matching_opts.lowe_ratio_threshold = 0.7f;
    // 特征描述子的维度
    surf_matching_opts.descriptor_length = 64;
    surf_matching_opts.distance_threshold = std::numeric_limits<float>::max();

#if DISCRETIZE_DESCRIPTORS
    util::AlignedMemory<math::Vec64s, 16> surf_descr1, surf_descr2;
#else
    util::AlignedMemory<math::Vec64f, 16> surf_descr1, surf_descr2;
#endif
    // 将描述子转化成特殊的格式
    convert_surf_descriptors(feat1.surf_descriptors, &surf_descr1);
    convert_surf_descriptors(feat2.surf_descriptors, &surf_descr2);

    // 进行surf描述子的双向匹配
    sfm::Matching::Result surf_matching;
    sfm::Matching::twoway_match(surf_matching_opts,
        surf_descr1.data()->begin(), surf_descr1.size(),
        surf_descr2.data()->begin(), surf_descr2.size(),
        &surf_matching);
    // 去除不一致的匹配对，匹配对feature 1 和 feature 2 互为最近邻
    sfm::Matching::remove_inconsistent_matches(&surf_matching);
    std::cout << "Consistent Surf Matches: "
        << sfm::Matching::count_consistent_matches(surf_matching)
        << std::endl;

    // 对sift匹配的结果和surf匹配的结果进行融合
    sfm::Matching::Result matching;
    sfm::Matching::combine_results(sift_matching, surf_matching, &matching);

    std::cout << "Consistent Matches: "
        << sfm::Matching::count_consistent_matches(matching)
        << std::endl;

    /* 特征匹配可视化 */
    /* Draw features. */
    std::vector<sfm::Visualizer::Keypoint> features1;
    for (std::size_t i = 0; i < feat1.sift_descriptors.size(); ++i)
    {
        if (matching.matches_1_2[i] == -1)
            continue;

        sfm::Sift::Descriptor const& descr = feat1.sift_descriptors[i];
        sfm::Visualizer::Keypoint kp;
        kp.orientation = descr.orientation;
        kp.radius = descr.scale * 3.0f;
        kp.x = descr.x;
        kp.y = descr.y;
        features1.push_back(kp);
    }

    std::vector<sfm::Visualizer::Keypoint> features2;
    for (std::size_t i = 0; i < feat2.sift_descriptors.size(); ++i)
    {
        if (matching.matches_2_1[i] == -1)
            continue;

        sfm::Sift::Descriptor const& descr = feat2.sift_descriptors[i];
        sfm::Visualizer::Keypoint kp;
        kp.orientation = descr.orientation;
        kp.radius = descr.scale * 3.0f;
        kp.x = descr.x;
        kp.y = descr.y;
        features2.push_back(kp);
    }

    image1 = sfm::Visualizer::draw_keypoints(image1,
        features1, sfm::Visualizer::RADIUS_BOX_ORIENTATION);
    image2 = sfm::Visualizer::draw_keypoints(image2,
        features2, sfm::Visualizer::RADIUS_BOX_ORIENTATION);

    core::ByteImage::Ptr match_image = visualize_matching(
        matching, image1, image2, feat1.positions, feat2.positions);
    std::string output_filename = "./tmp/matching_featureset.png";
    std::cout << "Saving visualization to " << output_filename << std::endl;
    core::image::save_file(match_image, output_filename);
}